

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

exr_result_t unpack_half_to_float_4chan_planar(exr_decode_pipeline_t *decode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  exr_coding_channel_info_t *peVar8;
  float *pfVar9;
  long lVar10;
  float *pfVar11;
  uint16_t *puVar12;
  int iVar13;
  float *pfVar14;
  float *pfVar15;
  
  peVar8 = decode->channels;
  iVar1 = (decode->chunk).height;
  iVar2 = decode->user_line_end_ignore;
  iVar3 = peVar8->width;
  lVar10 = (long)iVar3;
  iVar4 = peVar8->user_line_stride;
  iVar5 = peVar8[1].user_line_stride;
  iVar6 = peVar8[2].user_line_stride;
  iVar7 = peVar8[3].user_line_stride;
  pfVar9 = (float *)(peVar8->field_12).decode_to_ptr;
  pfVar15 = (float *)peVar8[1].field_12.decode_to_ptr;
  pfVar11 = (float *)peVar8[2].field_12.decode_to_ptr;
  pfVar14 = (float *)peVar8[3].field_12.decode_to_ptr;
  iVar13 = decode->user_line_begin_skip;
  puVar12 = (uint16_t *)((long)(iVar3 * 8 * iVar13) + (long)decode->unpacked_buffer);
  for (; iVar13 < iVar1 - iVar2; iVar13 = iVar13 + 1) {
    (*half_to_float_buffer)(pfVar9,puVar12,iVar3);
    (*half_to_float_buffer)(pfVar15,puVar12 + lVar10,iVar3);
    (*half_to_float_buffer)(pfVar11,puVar12 + lVar10 * 2,iVar3);
    (*half_to_float_buffer)(pfVar14,puVar12 + lVar10 * 3,iVar3);
    pfVar9 = (float *)((long)pfVar9 + (long)iVar4);
    pfVar15 = (float *)((long)pfVar15 + (long)iVar5);
    pfVar11 = (float *)((long)pfVar11 + (long)iVar6);
    pfVar14 = (float *)((long)pfVar14 + (long)iVar7);
    puVar12 = (uint16_t *)((long)(iVar3 * 8) + (long)puVar12);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_half_to_float_4chan_planar (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2, *in3;
    uint8_t *       out0, *out1, *out2, *out3;
    int             w, h;
    int             linc0, linc1, linc2, linc3;

    w     = decode->channels[0].width;
    h     = decode->chunk.height - decode->user_line_end_ignore;
    linc0 = decode->channels[0].user_line_stride;
    linc1 = decode->channels[1].user_line_stride;
    linc2 = decode->channels[2].user_line_stride;
    linc3 = decode->channels[3].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;
    out1 = decode->channels[1].decode_to_ptr;
    out2 = decode->channels[2].decode_to_ptr;
    out3 = decode->channels[3].decode_to_ptr;

    /*
     * not actually using y in the loop, so just pre-increment
     * the srcbuffer for any skip
     */
    srcbuffer += decode->user_line_begin_skip * w * 8;

    // planar output
    for (int y = decode->user_line_begin_skip; y < h; ++y)
    {
        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;
        in3 = in2 + w;
        srcbuffer += w * 8; // 4 * sizeof(uint16_t), avoid type conversion

        half_to_float_buffer ((float*) out0, in0, w);
        half_to_float_buffer ((float*) out1, in1, w);
        half_to_float_buffer ((float*) out2, in2, w);
        half_to_float_buffer ((float*) out3, in3, w);

        out0 += linc0;
        out1 += linc1;
        out2 += linc2;
        out3 += linc3;
    }
    return EXR_ERR_SUCCESS;
}